

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O2

void alGenSources(ALsizei n,ALuint *sources)

{
  vector<SourceSubList> *this;
  uint uVar1;
  ContextRef CVar2;
  pointer pSVar3;
  ALsource *pAVar4;
  char *pcVar5;
  ulong uVar6;
  long lVar7;
  ContextRef context;
  vector<ALuint> ids;
  unique_lock<std::mutex> srclock;
  
  GetContextRef();
  if (context.mPtr != (ALCcontext *)0x0) {
    if (n < 0) {
      ALCcontext::setError(context.mPtr,0xa003,"Generating %d sources",(ulong)(uint)n);
    }
    else if (n != 0) {
      std::unique_lock<std::mutex>::unique_lock(&srclock,&(context.mPtr)->mSourceLock);
      CVar2 = context;
      uVar1 = (((context.mPtr)->mDevice).mPtr)->SourcesMax;
      if (uVar1 - (context.mPtr)->mNumSources < (uint)n) {
        ALCcontext::setError
                  (context.mPtr,0xa005,"Exceeding %u source limit (%u + %d)",(ulong)uVar1,
                   (ulong)(context.mPtr)->mNumSources,(ulong)(uint)n);
      }
      else {
        this = &(context.mPtr)->mSourceList;
        lVar7 = 0;
        for (pSVar3 = ((context.mPtr)->mSourceList).
                      super__Vector_base<SourceSubList,_al::allocator<SourceSubList,_8UL>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pSVar3 != ((context.mPtr)->mSourceList).
                      super__Vector_base<SourceSubList,_al::allocator<SourceSubList,_8UL>_>._M_impl.
                      super__Vector_impl_data._M_finish; pSVar3 = pSVar3 + 1) {
          uVar6 = pSVar3->FreeMask - (pSVar3->FreeMask >> 1 & 0x5555555555555555);
          uVar6 = (uVar6 >> 2 & 0x3333333333333333) + (uVar6 & 0x3333333333333333);
          lVar7 = lVar7 + (((uVar6 >> 4) + uVar6 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >> 0x38);
        }
        uVar6 = lVar7 - 0x40;
        do {
          uVar6 = uVar6 + 0x40;
          if ((uint)n <= uVar6) {
            if (n == 1) {
              pAVar4 = anon_unknown.dwarf_50b73::AllocSource(context.mPtr);
              *sources = pAVar4->id;
            }
            else {
              ids.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              ids.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              ids.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::vector<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::reserve
                        (&ids,(ulong)(uint)n);
              do {
                pAVar4 = anon_unknown.dwarf_50b73::AllocSource(context.mPtr);
                std::vector<unsigned_int,al::allocator<unsigned_int,4ul>>::
                emplace_back<unsigned_int&>
                          ((vector<unsigned_int,al::allocator<unsigned_int,4ul>> *)&ids,&pAVar4->id)
                ;
                n = n + -1;
              } while (n != 0);
              if ((long)ids.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)ids.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                        _M_impl.super__Vector_impl_data._M_start != 0) {
                memmove(sources,ids.
                                super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                        (long)ids.
                              super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)ids.
                              super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>.
                              _M_impl.super__Vector_impl_data._M_start);
              }
              std::_Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>::~_Vector_base
                        (&ids.super__Vector_base<unsigned_int,_al::allocator<unsigned_int,_4UL>_>);
            }
            goto LAB_0011ff79;
          }
          if (0x1ffffff0 <
              (ulong)((long)((CVar2.mPtr)->mSourceList).
                            super__Vector_base<SourceSubList,_al::allocator<SourceSubList,_8UL>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)((CVar2.mPtr)->mSourceList).
                           super__Vector_base<SourceSubList,_al::allocator<SourceSubList,_8UL>_>.
                           _M_impl.super__Vector_impl_data._M_start)) goto LAB_0011fecd;
          std::vector<SourceSubList,_al::allocator<SourceSubList,_8UL>_>::emplace_back<>(this);
          pSVar3 = ((CVar2.mPtr)->mSourceList).
                   super__Vector_base<SourceSubList,_al::allocator<SourceSubList,_8UL>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pSVar3[-1].FreeMask = 0xffffffffffffffff;
          pAVar4 = (ALsource *)al_calloc(8,0x6600);
          pSVar3[-1].Sources = pAVar4;
        } while (pAVar4 != (ALsource *)0x0);
        std::vector<SourceSubList,_al::allocator<SourceSubList,_8UL>_>::pop_back(this);
LAB_0011fecd:
        pcVar5 = "s";
        if (n == 1) {
          pcVar5 = "";
        }
        ALCcontext::setError
                  (context.mPtr,0xa005,"Failed to allocate %d source%s",(ulong)(uint)n,pcVar5);
      }
LAB_0011ff79:
      std::unique_lock<std::mutex>::~unique_lock(&srclock);
    }
  }
  al::intrusive_ptr<ALCcontext>::~intrusive_ptr(&context);
  return;
}

Assistant:

AL_API void AL_APIENTRY alGenSources(ALsizei n, ALuint *sources)
START_API_FUNC
{
    ContextRef context{GetContextRef()};
    if UNLIKELY(!context) return;

    if UNLIKELY(n < 0)
        context->setError(AL_INVALID_VALUE, "Generating %d sources", n);
    if UNLIKELY(n <= 0) return;

    std::unique_lock<std::mutex> srclock{context->mSourceLock};
    ALCdevice *device{context->mDevice.get()};
    if(static_cast<ALuint>(n) > device->SourcesMax-context->mNumSources)
    {
        context->setError(AL_OUT_OF_MEMORY, "Exceeding %u source limit (%u + %d)",
            device->SourcesMax, context->mNumSources, n);
        return;
    }
    if(!EnsureSources(context.get(), static_cast<ALuint>(n)))
    {
        context->setError(AL_OUT_OF_MEMORY, "Failed to allocate %d source%s", n, (n==1)?"":"s");
        return;
    }

    if(n == 1)
    {
        ALsource *source{AllocSource(context.get())};
        sources[0] = source->id;
    }
    else
    {
        al::vector<ALuint> ids;
        ids.reserve(static_cast<ALuint>(n));
        do {
            ALsource *source{AllocSource(context.get())};
            ids.emplace_back(source->id);
        } while(--n);
        std::copy(ids.cbegin(), ids.cend(), sources);
    }
}